

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::solveUleftNoNZ
          (CLUFactor<double> *this,double eps,double *vec,double *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  pointer pdVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  double *pdVar21;
  uint uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  
  if (0 < rhsn) {
    piVar3 = (this->row).orig;
    piVar4 = (this->col).orig;
    piVar5 = (this->col).perm;
    uVar14 = 0;
    do {
      iVar1 = piVar5[rhsidx[uVar14]];
      if (uVar14 == 0) {
        lVar13 = 0;
      }
      else {
        uVar23 = uVar14 & 0xffffffff;
        do {
          uVar11 = (uint)uVar23 - 1;
          uVar22 = uVar11 >> 1;
          uVar19 = (uint)uVar23;
          if (rhsidx[uVar22] <= iVar1) break;
          rhsidx[uVar23] = rhsidx[uVar22];
          uVar23 = (ulong)uVar22;
          uVar19 = uVar22;
        } while (1 < uVar11);
        lVar13 = (long)(int)uVar19;
      }
      uVar14 = uVar14 + 1;
      rhsidx[lVar13] = iVar1;
    } while (uVar14 != (uint)rhsn);
    if (0 < rhsn) {
      pdVar6 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->u).row.idx;
      piVar8 = (this->u).row.len;
      piVar9 = (this->u).row.start;
      pdVar10 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar1 = *rhsidx;
        uVar19 = rhsn - 1;
        uVar14 = (ulong)uVar19;
        iVar16 = rhsidx[uVar14];
        if ((uint)rhsn < 4) {
          iVar18 = 1;
          iVar20 = 0;
        }
        else {
          iVar18 = 1;
          iVar20 = 0;
          do {
            iVar2 = rhsidx[iVar18];
            iVar12 = rhsidx[(long)iVar18 + 1];
            if (iVar2 < iVar12) {
              iVar17 = iVar18;
              iVar12 = iVar2;
              if (iVar16 <= iVar2) goto LAB_00207532;
            }
            else {
              if (iVar16 <= iVar12) goto LAB_00207532;
              iVar17 = iVar18 + 1;
            }
            rhsidx[iVar20] = iVar12;
            iVar18 = iVar17 * 2 + 1;
            iVar20 = iVar17;
          } while (iVar18 < (int)(rhsn - 2U));
        }
        if ((iVar18 < (int)uVar19) && (rhsidx[iVar18] < iVar16)) {
          rhsidx[iVar20] = rhsidx[iVar18];
          iVar20 = iVar18;
        }
LAB_00207532:
        rhsidx[iVar20] = iVar16;
        iVar16 = piVar4[iVar1];
        dVar24 = rhs[iVar16];
        rhs[iVar16] = 0.0;
        rhsn = uVar19;
        if (eps < ABS(dVar24)) {
          iVar1 = piVar3[iVar1];
          dVar24 = dVar24 * pdVar10[iVar1];
          vec[iVar1] = dVar24;
          iVar16 = piVar8[iVar1];
          if (iVar16 != 0) {
            iVar1 = piVar9[iVar1];
            pdVar21 = pdVar6 + iVar1;
            piVar15 = piVar7 + iVar1;
            do {
              iVar1 = *piVar15;
              dVar25 = rhs[iVar1];
              if ((dVar25 != 0.0) || (NAN(dVar25))) {
                dVar25 = dVar25 - *pdVar21 * dVar24;
                uVar23 = -(ulong)(dVar25 != 0.0);
                rhs[iVar1] = (double)(~uVar23 & 0x2b2bff2ee48e0530 | (ulong)dVar25 & uVar23);
              }
              else {
                dVar25 = *pdVar21 * -dVar24;
                if (eps < ABS(dVar25)) {
                  rhs[iVar1] = dVar25;
                  iVar1 = piVar5[iVar1];
                  iVar20 = (int)uVar14;
                  uVar23 = uVar14;
                  if (0 < iVar20) {
                    do {
                      uVar19 = (int)uVar14 - 1;
                      uVar11 = uVar19 >> 1;
                      uVar23 = uVar14;
                      if (rhsidx[uVar11] <= iVar1) break;
                      rhsidx[uVar14] = rhsidx[uVar11];
                      uVar14 = (ulong)uVar11;
                      uVar23 = (ulong)uVar11;
                    } while (1 < uVar19);
                  }
                  uVar14 = (ulong)(iVar20 + 1);
                  rhsidx[(int)uVar23] = iVar1;
                }
              }
              rhsn = (int)uVar14;
              piVar15 = piVar15 + 1;
              pdVar21 = pdVar21 + 1;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
        }
      } while (0 < rhsn);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}